

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtDec.c
# Opt level: O3

void Rwt_ManPreprocess(Rwt_Man_t *p)

{
  byte bVar1;
  uint *puVar2;
  Dec_Edge_t DVar3;
  unsigned_short *puVar4;
  Vec_Vec_t *pVVar5;
  void **ppvVar6;
  void *pvVar7;
  Rwt_Node_t *pGraph;
  Rwt_Node_t *pRVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  Rwt_Node_t *pRVar17;
  
  puVar4 = (unsigned_short *)calloc(1,0x1bc);
  p->pMapInv = puVar4;
  pVVar5 = (Vec_Vec_t *)malloc(0x10);
  pVVar5->nCap = 0xde;
  ppvVar6 = (void **)malloc(0x6f0);
  pVVar5->pArray = ppvVar6;
  lVar11 = 0;
  do {
    pvVar7 = calloc(1,0x10);
    ppvVar6[lVar11] = pvVar7;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0xde);
  pVVar5->nSize = 0xde;
  p->vClasses = pVVar5;
  iVar10 = p->nFuncs;
  if (iVar10 < 1) {
    uVar9 = 0xde;
  }
  else {
    lVar11 = 0;
    do {
      pRVar17 = p->pTable[lVar11];
      if (pRVar17 != (Rwt_Node_t *)0x0) {
        do {
          if (*(ushort *)&pRVar17->field_0x8 != *(ushort *)&p->pTable[lVar11]->field_0x8) {
            __assert_fail("pNode->uTruth == p->pTable[i]->uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwt/rwtDec.c"
                          ,0x41,"void Rwt_ManPreprocess(Rwt_Man_t *)");
          }
          bVar1 = p->pMap[*(ushort *)&pRVar17->field_0x8];
          if (0xdd < bVar1) {
            __assert_fail("p->pMap[pNode->uTruth] < 222",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwt/rwtDec.c"
                          ,0x42,"void Rwt_ManPreprocess(Rwt_Man_t *)");
          }
          pVVar5 = p->vClasses;
          uVar16 = pVVar5->nSize;
          uVar14 = (uint)bVar1;
          uVar15 = (uint)bVar1;
          if ((int)uVar14 < (int)uVar16) {
            if (uVar16 < bVar1 || uVar16 == uVar14) goto LAB_008dc349;
          }
          else {
            iVar10 = bVar1 + 1;
            if (pVVar5->nCap <= (int)uVar14) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)(uint)(iVar10 * 8));
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)(uint)(iVar10 * 8));
                uVar16 = pVVar5->nSize;
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = iVar10;
            }
            if ((int)uVar16 <= (int)uVar15) {
              lVar13 = (long)(int)uVar16;
              iVar12 = (uVar15 - uVar16) + 1;
              do {
                pvVar7 = calloc(1,0x10);
                pVVar5->pArray[lVar13] = pvVar7;
                lVar13 = lVar13 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            pVVar5->nSize = iVar10;
          }
          puVar2 = (uint *)pVVar5->pArray[uVar15];
          uVar16 = puVar2[1];
          if (uVar16 == *puVar2) {
            if ((int)uVar16 < 0x10) {
              if (*(void **)(puVar2 + 2) == (void *)0x0) {
                pvVar7 = malloc(0x80);
              }
              else {
                pvVar7 = realloc(*(void **)(puVar2 + 2),0x80);
              }
              *(void **)(puVar2 + 2) = pvVar7;
              *puVar2 = 0x10;
            }
            else {
              if (*(void **)(puVar2 + 2) == (void *)0x0) {
                pvVar7 = malloc((ulong)uVar16 << 4);
              }
              else {
                pvVar7 = realloc(*(void **)(puVar2 + 2),(ulong)uVar16 << 4);
              }
              *(void **)(puVar2 + 2) = pvVar7;
              *puVar2 = uVar16 * 2;
            }
          }
          else {
            pvVar7 = *(void **)(puVar2 + 2);
          }
          uVar16 = puVar2[1];
          puVar2[1] = uVar16 + 1;
          *(Rwt_Node_t **)((long)pvVar7 + (long)(int)uVar16 * 8) = pRVar17;
          p->pMapInv[p->pMap[*(ushort *)&pRVar17->field_0x8]] =
               p->puCanons[*(ushort *)&pRVar17->field_0x8];
          pRVar17 = pRVar17->pNext;
        } while (pRVar17 != (Rwt_Node_t *)0x0);
        iVar10 = p->nFuncs;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar10);
    pVVar5 = p->vClasses;
    uVar9 = (ulong)(uint)pVVar5->nSize;
    if (pVVar5->nSize < 1) {
      return;
    }
  }
  lVar11 = 0;
  while (lVar11 < (int)uVar9) {
    pvVar7 = pVVar5->pArray[lVar11];
    if (0 < *(int *)((long)pvVar7 + 4)) {
      lVar13 = 0;
      do {
        pRVar17 = *(Rwt_Node_t **)(*(long *)((long)pvVar7 + 8) + lVar13 * 8);
        if (((ulong)pRVar17 & 1) != 0) {
          __assert_fail("!Rwt_IsComplement(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwt/rwtDec.c"
                        ,0x5f,"Dec_Graph_t *Rwt_NodePreprocess(Rwt_Man_t *, Rwt_Node_t *)");
        }
        if (*(short *)&pRVar17->field_0x8 == 0xff) {
          pGraph = (Rwt_Node_t *)calloc(1,0x20);
          *(undefined8 *)&pGraph->TravId = 0x400000004;
          *(undefined4 *)&pGraph->field_0xc = 0x3a;
          pRVar8 = (Rwt_Node_t *)malloc(0x570);
          pGraph->p0 = pRVar8;
          pRVar8->Id = 0;
          pRVar8->TravId = 0;
          *(undefined8 *)&pRVar8->field_0x8 = 0;
          pRVar8->p0 = (Rwt_Node_t *)0x0;
          pRVar8->p1 = (Rwt_Node_t *)0x0;
          pRVar8->pNext = (Rwt_Node_t *)0x0;
          pRVar8[1].Id = 0;
          pRVar8[1].TravId = 0;
          *(undefined8 *)&pRVar8[1].field_0x8 = 0;
          pRVar8[1].p0 = (Rwt_Node_t *)0x0;
          pRVar8[1].p1 = (Rwt_Node_t *)0x0;
          pRVar8[1].pNext = (Rwt_Node_t *)0x0;
          pRVar8[2].Id = 0;
          pRVar8[2].TravId = 0;
          *(undefined8 *)&pRVar8[2].field_0x8 = 0;
          DVar3 = (Dec_Edge_t)0x7;
        }
        else if (*(short *)&pRVar17->field_0x8 == 0) {
          pGraph = (Rwt_Node_t *)calloc(1,0x20);
          pGraph->Id = 1;
          DVar3 = (Dec_Edge_t)0x1;
        }
        else {
          pGraph = (Rwt_Node_t *)calloc(1,0x20);
          *(undefined8 *)&pGraph->TravId = 0x400000004;
          *(undefined4 *)&pGraph->field_0xc = 0x3a;
          pRVar8 = (Rwt_Node_t *)malloc(0x570);
          pGraph->p0 = pRVar8;
          pRVar8->Id = 0;
          pRVar8->TravId = 0;
          *(undefined8 *)&pRVar8->field_0x8 = 0;
          pRVar8->p0 = (Rwt_Node_t *)0x0;
          pRVar8->p1 = (Rwt_Node_t *)0x0;
          pRVar8->pNext = (Rwt_Node_t *)0x0;
          pRVar8[1].Id = 0;
          pRVar8[1].TravId = 0;
          *(undefined8 *)&pRVar8[1].field_0x8 = 0;
          pRVar8[1].p0 = (Rwt_Node_t *)0x0;
          pRVar8[1].p1 = (Rwt_Node_t *)0x0;
          pRVar8[1].pNext = (Rwt_Node_t *)0x0;
          pRVar8[2].Id = 0;
          pRVar8[2].TravId = 0;
          *(undefined8 *)&pRVar8[2].field_0x8 = 0;
          Rwt_ManIncTravId(p);
          DVar3 = Rwt_TravCollect_rec(p,pRVar17,(Dec_Graph_t *)pGraph);
          pVVar5 = p->vClasses;
        }
        *(Dec_Edge_t *)&pGraph->p1 = DVar3;
        pRVar17->pNext = pGraph;
        uVar9 = (ulong)pVVar5->nSize;
        if ((long)uVar9 <= lVar11) goto LAB_008dc349;
        lVar13 = lVar13 + 1;
        pvVar7 = pVVar5->pArray[lVar11];
      } while (lVar13 < *(int *)((long)pvVar7 + 4));
    }
    lVar11 = lVar11 + 1;
    if ((int)uVar9 <= lVar11) {
      return;
    }
  }
LAB_008dc349:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

void Rwt_ManPreprocess( Rwt_Man_t * p )
{
    Dec_Graph_t * pGraph;
    Rwt_Node_t * pNode;
    int i, k;
    // put the nodes into the structure
    p->pMapInv  = ABC_ALLOC( unsigned short, 222 );
    memset( p->pMapInv, 0, sizeof(unsigned short) * 222 );
    p->vClasses = Vec_VecStart( 222 );
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( p->pTable[i] == NULL )
            continue;
        // consider all implementations of this function
        for ( pNode = p->pTable[i]; pNode; pNode = pNode->pNext )
        {
            assert( pNode->uTruth == p->pTable[i]->uTruth );
            assert( p->pMap[pNode->uTruth] < 222 ); // Always >= 0 b/c unsigned.
            Vec_VecPush( p->vClasses, p->pMap[pNode->uTruth], pNode );
            p->pMapInv[ p->pMap[pNode->uTruth] ] = p->puCanons[pNode->uTruth];
        }
    }
    // compute decomposition forms for each node and verify them
    Vec_VecForEachEntry( Rwt_Node_t *, p->vClasses, pNode, i, k )
    {
        pGraph = Rwt_NodePreprocess( p, pNode );
        pNode->pNext = (Rwt_Node_t *)pGraph;
//        assert( pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF) );
    }
}